

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy(void)

{
  bool bVar1;
  Pipeline *pPVar2;
  Model *m;
  Model *m_00;
  Model *m_01;
  Model *m_02;
  Model *m_03;
  ostream *poVar3;
  ostream *poVar4;
  RepeatedPtrField<CoreML::Specification::Model> *this;
  int iVar5;
  char *pcVar6;
  undefined1 local_100 [40];
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesB;
  Result res;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesA;
  Model spec;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesA.name = "A";
  tensorAttributesA.dimension = 3;
  tensorAttributesA._12_4_ = 0;
  tensorAttributesB.name = "B";
  tensorAttributesB.dimension = 1;
  tensorAttributesB._12_4_ = 0;
  tensorAttributesC.name = "C";
  tensorAttributesC.dimension = 1;
  tensorAttributesC._12_4_ = 0;
  tensorAttributesD.name = "D";
  tensorAttributesD.dimension = 3;
  tensorAttributesD._12_4_ = 0;
  pPVar2 = buildEmptyPipelineModelWithStringOutput(&spec,false,&tensorAttributesA,"E");
  this = &pPVar2->models_;
  m = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this);
  m_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this);
  m_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this);
  buildBasicNeuralNetworkModel(m,false,&tensorAttributesA,&tensorAttributesB,1,false,false);
  pPVar2 = buildEmptyPipelineModel(m_00,false,&tensorAttributesB,&tensorAttributesD);
  buildBasicNearestNeighborClassifier(m_01,false,&tensorAttributesD,"E");
  m_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(&pPVar2->models_);
  m_03 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(&pPVar2->models_);
  buildBasicNeuralNetworkModel(m_02,false,&tensorAttributesB,&tensorAttributesC,1,false,false);
  buildBasicNeuralNetworkModel(m_03,true,&tensorAttributesC,&tensorAttributesD,1,false,false);
  addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(m_03,"D");
  CoreML::Model::validate((Result *)local_100,m);
  CoreML::Result::operator=(&res,(Result *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 8));
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    CoreML::Model::validate((Result *)local_100,m_00);
    CoreML::Result::operator=(&res,(Result *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (!bVar1) {
      CoreML::Model::validate((Result *)local_100,m_01);
      CoreML::Result::operator=(&res,(Result *)local_100);
      std::__cxx11::string::~string((string *)(local_100 + 8));
      bVar1 = CoreML::Result::good(&res);
      if (bVar1) {
        CoreML::Model::validate((Result *)local_100,m_02);
        CoreML::Result::operator=(&res,(Result *)local_100);
        std::__cxx11::string::~string((string *)(local_100 + 8));
        bVar1 = CoreML::Result::good(&res);
        if (bVar1) {
          CoreML::Model::validate((Result *)local_100,m_03);
          CoreML::Result::operator=(&res,(Result *)local_100);
          std::__cxx11::string::~string((string *)(local_100 + 8));
          bVar1 = CoreML::Result::good(&res);
          if (bVar1) {
            CoreML::Model::validate((Result *)local_100,&spec);
            CoreML::Result::operator=(&res,(Result *)local_100);
            std::__cxx11::string::~string((string *)(local_100 + 8));
            bVar1 = CoreML::Result::good(&res);
            iVar5 = 0;
            if (!bVar1) goto LAB_0016109a;
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                    );
            poVar4 = (ostream *)std::operator<<(poVar3,":");
            iVar5 = 0x494;
            goto LAB_00161014;
          }
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar4 = (ostream *)std::operator<<(poVar3,":");
          iVar5 = 0x490;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                  );
          poVar4 = (ostream *)std::operator<<(poVar3,":");
          iVar5 = 0x48d;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar4 = (ostream *)std::operator<<(poVar3,":");
        iVar5 = 0x48a;
      }
      goto LAB_0016105b;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = (ostream *)std::operator<<(poVar3,":");
    iVar5 = 0x487;
LAB_00161014:
    poVar3 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar6 = "!((res).good())";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = (ostream *)std::operator<<(poVar3,":");
    iVar5 = 0x484;
LAB_0016105b:
    poVar3 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar6 = "(res).good()";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar5 = 1;
LAB_0016109a:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar5;
}

Assistant:

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline1 = buildEmptyPipelineModelWithStringOutput(spec, false, &tensorAttributesA, "E");

    auto m1 = pipeline1->add_models();
    auto m2 = pipeline1->add_models();
    auto m3 = pipeline1->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    auto pipeline2 = buildEmptyPipelineModel(*m2, false, &tensorAttributesB, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m3, false, &tensorAttributesD, "E");

    auto m4 = pipeline2->add_models();
    auto m5 = pipeline2->add_models();

    (void)buildBasicNeuralNetworkModel(*m4, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m5, true, &tensorAttributesC, &tensorAttributesD);
    addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(*m5, "D");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m5);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to presence of uptable model in non-updatable pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}